

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          *handler)

{
  ConstMemberIterator CVar1;
  bool bVar2;
  Type TVar3;
  SizeType SVar4;
  Pointer pVVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *pGVar6;
  Ch *pCVar7;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *local_38;
  ConstValueIterator v;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_28;
  ConstMemberIterator m;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *handler_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  m.ptr_ = (Pointer)handler;
  TVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetType
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
  CVar1.ptr_ = m.ptr_;
  switch(TVar3) {
  case kNullType:
    this_local._7_1_ =
         Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         ::Null((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)m.ptr_);
    break;
  case kFalseType:
    this_local._7_1_ =
         Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         ::Bool((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)m.ptr_,false);
    break;
  case kTrueType:
    this_local._7_1_ =
         Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         ::Bool((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)m.ptr_,true);
    break;
  case kObjectType:
    bVar2 = Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            ::StartObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                           *)m.ptr_);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_28.ptr_ =
           (Pointer)GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberBegin
                              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this)
      ;
      while( true ) {
        v = (ConstValueIterator)
            GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
        bVar2 = GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
                operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                            *)&local_28,
                           (GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                            *)&v);
        if (!bVar2) break;
        pVVar5 = GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                 operator->(&local_28);
        bVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsString
                          (&pVVar5->name);
        CVar1 = m;
        if (!bVar2) {
          __assert_fail("m->name.IsString()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                        ,0x7a6,
                        "bool rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::Accept(Handler &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, Handler = rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>]"
                       );
        }
        pVVar5 = GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                 operator->(&local_28);
        pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                           (&pVVar5->name);
        pVVar5 = GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                 operator->(&local_28);
        SVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                          (&pVVar5->name);
        pVVar5 = GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                 operator->(&local_28);
        bVar2 = Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                ::Key((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                       *)CVar1.ptr_,pCVar7,SVar4,((pVVar5->name).data_.f.flags & 0x800) != 0);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          return false;
        }
        pVVar5 = GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                 operator->(&local_28);
        bVar2 = Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                           &pVVar5->value,
                           (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                            *)m.ptr_);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          return false;
        }
        GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator++
                  (&local_28);
      }
      this_local._7_1_ =
           Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ::EndObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)m.ptr_,*(SizeType *)this);
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case kArrayType:
    bVar2 = Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            ::StartArray((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                          *)m.ptr_);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      for (local_38 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Begin
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                                 this);
          pGVar6 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::End
                             ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this),
          local_38 != pGVar6; local_38 = local_38 + 0x10) {
        bVar2 = Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
                          (local_38,(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                                     *)m.ptr_);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      this_local._7_1_ =
           Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ::EndArray((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                       *)m.ptr_,*(SizeType *)this);
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case kStringType:
    pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                       ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
    SVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
    this_local._7_1_ =
         Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         ::String((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   *)CVar1.ptr_,pCVar7,SVar4,(*(ushort *)(this + 0xe) & 0x800) != 0);
    break;
  default:
    TVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetType
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
    if (TVar3 != kNumberType) {
      __assert_fail("GetType() == kNumberType",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0x7ba,
                    "bool rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::Accept(Handler &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, Handler = rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>]"
                   );
    }
    bVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsDouble
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
    if (bVar2) {
      this_local._7_1_ =
           Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ::Double((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                     *)m.ptr_,*(double *)this);
    }
    else {
      bVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsInt
                        ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
      if (bVar2) {
        this_local._7_1_ =
             Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             ::Int((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                    *)m.ptr_,*(int *)this);
      }
      else {
        bVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsUint
                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
        if (bVar2) {
          this_local._7_1_ =
               Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               ::Uint((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                       *)m.ptr_,*(uint *)this);
        }
        else {
          bVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsInt64
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
          if (bVar2) {
            this_local._7_1_ =
                 Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ::Int64((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                          *)m.ptr_,*(int64_t *)this);
          }
          else {
            this_local._7_1_ =
                 Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ::Uint64((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                           *)m.ptr_,*(uint64_t *)this);
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Accept(Handler& handler) const {
        switch(GetType()) {
        case kNullType:     return handler.Null();
        case kFalseType:    return handler.Bool(false);
        case kTrueType:     return handler.Bool(true);

        case kObjectType:
            if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
                return false;
            for (ConstMemberIterator m = MemberBegin(); m != MemberEnd(); ++m) {
                RAPIDJSON_ASSERT(m->name.IsString()); // User may change the type of name by MemberIterator.
                if (RAPIDJSON_UNLIKELY(!handler.Key(m->name.GetString(), m->name.GetStringLength(), (m->name.data_.f.flags & kCopyFlag) != 0)))
                    return false;
                if (RAPIDJSON_UNLIKELY(!m->value.Accept(handler)))
                    return false;
            }
            return handler.EndObject(data_.o.size);

        case kArrayType:
            if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
                return false;
            for (ConstValueIterator v = Begin(); v != End(); ++v)
                if (RAPIDJSON_UNLIKELY(!v->Accept(handler)))
                    return false;
            return handler.EndArray(data_.a.size);
    
        case kStringType:
            return handler.String(GetString(), GetStringLength(), (data_.f.flags & kCopyFlag) != 0);
    
        default:
            RAPIDJSON_ASSERT(GetType() == kNumberType);
            if (IsDouble())         return handler.Double(data_.n.d);
            else if (IsInt())       return handler.Int(data_.n.i.i);
            else if (IsUint())      return handler.Uint(data_.n.u.u);
            else if (IsInt64())     return handler.Int64(data_.n.i64);
            else                    return handler.Uint64(data_.n.u64);
        }
    }